

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_QuickSort2(word *pData,int nSize,int fDecrease)

{
  word wVar1;
  word wVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int l;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = nSize - 1;
  l = 0;
  if (fDecrease != 0) {
    Abc_QuickSort2Dec_rec(pData,0,uVar5);
    return;
  }
LAB_0042e50f:
  uVar4 = uVar5 - l;
  if (uVar4 != 0 && l <= (int)uVar5) {
    if (9 < (int)uVar4) {
      wVar1 = pData[(int)uVar5];
      uVar9 = (ulong)(l - 1);
      uVar7 = (ulong)uVar5;
      do {
        uVar9 = (long)(int)uVar9;
        do {
          uVar8 = uVar9;
          wVar2 = pData[uVar8 + 1];
          uVar9 = uVar8 + 1;
        } while ((uint)wVar2 < (uint)wVar1);
        uVar6 = (long)(int)uVar7;
        do {
          lVar3 = uVar6 - 1;
          uVar7 = uVar6 - 1;
          if (l + 1 == (int)uVar6) break;
          uVar6 = uVar7;
        } while ((uint)wVar1 < (uint)pData[lVar3]);
        if ((long)uVar7 <= (long)uVar9) goto LAB_0042e561;
        pData[uVar9] = pData[lVar3];
        pData[uVar7] = wVar2;
      } while( true );
    }
    if (0 < (int)uVar4) {
      uVar7 = 1;
      uVar9 = 0;
      do {
        uVar6 = uVar9 & 0xffffffff;
        uVar8 = uVar7;
        do {
          uVar5 = (uint)uVar8;
          if ((uint)pData[(long)l + (long)(int)(uint)uVar6] <= (uint)pData[(long)l + uVar8]) {
            uVar5 = (uint)uVar6;
          }
          uVar8 = uVar8 + 1;
          uVar6 = (ulong)uVar5;
        } while (uVar4 + 1 != uVar8);
        wVar1 = pData[(long)l + uVar9];
        pData[(long)l + uVar9] = pData[(long)l + (long)(int)uVar5];
        uVar9 = uVar9 + 1;
        pData[(long)l + (long)(int)uVar5] = wVar1;
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar4);
    }
  }
  return;
LAB_0042e561:
  pData[uVar9] = pData[(int)uVar5];
  pData[(int)uVar5] = wVar2;
  Abc_QuickSort2Inc_rec(pData,l,(int)uVar8);
  l = (int)uVar8 + 2;
  goto LAB_0042e50f;
}

Assistant:

void Abc_QuickSort2( word * pData, int nSize, int fDecrease )
{
    int i, fVerify = 0;
    if ( fDecrease )
    {
        Abc_QuickSort2Dec_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] >= (unsigned)pData[i] );
    }
    else
    {
        Abc_QuickSort2Inc_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] <= (unsigned)pData[i] );
    }
}